

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(CordRepBtree *tree,CordRep *rep)

{
  CordRepBtree *pCVar1;
  Invoker<void,_absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long> in_RCX;
  FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
  consume_fn;
  anon_class_8_1_8992209c consume;
  CordRepBtree *local_18;
  undefined1 *local_10;
  
  local_10 = (undefined1 *)&local_18;
  local_18 = tree;
  if (rep->tag == '\x03') {
    pCVar1 = CordRep::btree(rep);
    pCVar1 = MergeTrees(pCVar1,tree);
    return pCVar1;
  }
  consume_fn.invoker_ = in_RCX;
  consume_fn.ptr_.fun =
       functional_internal::
       InvokeObject<absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(absl::lts_20250127::cord_internal::CordRepBtree*,absl::lts_20250127::cord_internal::CordRep*)::__0,void,absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long>
  ;
  ReverseConsume((cord_internal *)rep,(CordRep *)&local_10,consume_fn);
  return local_18;
}

Assistant:

CordRepBtree* CordRepBtree::PrependSlow(CordRepBtree* tree, CordRep* rep) {
  if (ABSL_PREDICT_TRUE(rep->IsBtree())) {
    return MergeTrees(rep->btree(), tree);
  }
  auto consume = [&tree](CordRep* r, size_t offset, size_t length) {
    r = MakeSubstring(r, offset, length);
    tree = CordRepBtree::AddCordRep<kFront>(tree, r);
  };
  ReverseConsume(rep, consume);
  return tree;
}